

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O3

void __thiscall
helics::RandomDelayFilterOperation::RandomDelayFilterOperation(RandomDelayFilterOperation *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  RandomDelayGenerator *pRVar2;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  (this->super_FilterOperations)._vptr_FilterOperations =
       (_func_int **)&PTR__RandomDelayFilterOperation_0054ba70;
  (this->td).super___shared_ptr<helics::MessageTimeOperator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0054bd20;
  local_40._8_8_ = 0;
  local_28 = std::
             _Function_handler<TimeRepresentation<count_time<9,_long>_>_(TimeRepresentation<count_time<9,_long>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FilterOperations.cpp:218:9)>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<TimeRepresentation<count_time<9,_long>_>_(TimeRepresentation<count_time<9,_long>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FilterOperations.cpp:218:9)>
             ::_M_manager;
  local_40._M_unused._M_object = this;
  MessageTimeOperator::MessageTimeOperator
            ((MessageTimeOperator *)(p_Var1 + 1),
             (function<TimeRepresentation<count_time<9,_long>_>_(TimeRepresentation<count_time<9,_long>_>)>
              *)&local_40);
  if (local_30 != (code *)0x0) {
    (*local_30)((_Any_data *)&local_40,(_Any_data *)&local_40,__destroy_functor);
  }
  (this->td).super___shared_ptr<helics::MessageTimeOperator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = p_Var1;
  (this->td).super___shared_ptr<helics::MessageTimeOperator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (MessageTimeOperator *)(p_Var1 + 1);
  pRVar2 = (RandomDelayGenerator *)operator_new(0x18);
  *(undefined8 *)pRVar2 = 0;
  (pRVar2->param1).super___atomic_float<double>._M_fp = 0.0;
  (pRVar2->dist)._M_i = UNIFORM;
  (pRVar2->param1).super___atomic_float<double>._M_fp = 0.0;
  (pRVar2->param2).super___atomic_float<double>._M_fp = 0.0;
  (this->rdelayGen)._M_t.
  super___uniq_ptr_impl<helics::RandomDelayGenerator,_std::default_delete<helics::RandomDelayGenerator>_>
  ._M_t.
  super__Tuple_impl<0UL,_helics::RandomDelayGenerator_*,_std::default_delete<helics::RandomDelayGenerator>_>
  .super__Head_base<0UL,_helics::RandomDelayGenerator_*,_false>._M_head_impl = pRVar2;
  return;
}

Assistant:

RandomDelayFilterOperation::RandomDelayFilterOperation():
    td(std::make_shared<MessageTimeOperator>(
        [this](Time messageTime) { return messageTime + rdelayGen->generate(); })),
    rdelayGen(std::make_unique<RandomDelayGenerator>())
{
}